

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int64_t __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  LogMessage *pLVar4;
  byte *pbVar5;
  undefined1 auVar6 [16];
  pair<bool,_const_unsigned_char_*> pVar7;
  ulong local_180;
  uint local_13c [2];
  uint32_t temp_1;
  pair<bool,_const_unsigned_char_*> p;
  uint32_t temp;
  LogMessageFatal local_108 [23];
  Voidify local_f1;
  int local_f0;
  uint local_ec;
  string *local_e8;
  string *absl_log_internal_check_op_result;
  CodedInputStream *pCStack_d8;
  uint32_t first_byte_or_zero_local;
  CodedInputStream *this_local;
  bool local_c6;
  bool local_c5;
  int local_c4;
  int local_c0;
  int i;
  uint32_t result;
  uint32_t b;
  uint8_t *ptr;
  undefined8 local_a8;
  LogMessageFatal local_a0 [23];
  Voidify local_89;
  int local_88;
  uint local_84;
  string *local_80;
  string *absl_log_internal_check_op_result_2;
  undefined1 local_68 [16];
  LogMessageFatal local_58 [23];
  Voidify local_41;
  uint local_40;
  uchar local_39;
  string *local_38;
  string *absl_log_internal_check_op_result_1;
  uchar *local_28;
  uint local_1c;
  byte local_18;
  uint8_t *local_10;
  
  absl_log_internal_check_op_result._4_4_ = first_byte_or_zero;
  pCStack_d8 = this;
  iVar3 = BufferSize(this);
  if ((iVar3 < 10) &&
     ((this->buffer_end_ <= this->buffer_ || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    bVar2 = ReadVarint32Slow(this,local_13c);
    if (bVar2) {
      local_180 = (ulong)local_13c[0];
    }
    else {
      local_180 = 0xffffffffffffffff;
    }
    return local_180;
  }
  local_ec = absl::lts_20240722::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._4_4_);
  local_f0 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_e8 = absl::lts_20240722::log_internal::Check_NEImpl<unsigned_int,int>
                       (&local_ec,&local_f0,"first_byte_or_zero != 0");
  if (local_e8 != (string *)0x0) {
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_e8);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x206,auVar6._0_8_,auVar6._8_8_);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_108);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [64])
                               "Caller should provide us with *buffer_ when buffer is non-empty");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_f1,pLVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_108);
  }
  local_28 = this->buffer_;
  local_1c = absl_log_internal_check_op_result._4_4_;
  absl_log_internal_check_op_result_1 = (string *)&p.second;
  local_39 = absl::lts_20240722::log_internal::GetReferenceableValue(*local_28);
  local_40 = absl::lts_20240722::log_internal::GetReferenceableValue(local_1c);
  local_38 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_char,unsigned_int>
                       (&local_39,&local_40,"*buffer == first_byte");
  if (local_38 != (string *)0x0) {
    local_68 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x1ad,local_68._0_8_,local_68._8_8_);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_58);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_41,pLVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
  }
  local_84 = absl::lts_20240722::log_internal::GetReferenceableValue(local_1c & 0x80);
  local_88 = absl::lts_20240722::log_internal::GetReferenceableValue(0x80);
  local_80 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_int,int>
                       (&local_84,&local_88,"first_byte & 0x80 == 0x80");
  if (local_80 != (string *)0x0) {
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_80);
    local_a8 = auVar6._8_8_;
    ptr = auVar6._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x1ae,ptr,local_a8);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a0);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,local_1c);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_89,pLVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a0);
  }
  _result = local_28 + 2;
  i = (int)local_28[1];
  local_c0 = i * 0x80 + (local_1c - 0x80);
  if ((local_28[1] & 0x80) != 0) {
    bVar1 = *_result;
    i = (int)bVar1;
    local_c0 = i * 0x4000 + local_c0 + -0x4000;
    _result = local_28 + 3;
    if ((bVar1 & 0x80) != 0) {
      bVar1 = local_28[3];
      i = (int)bVar1;
      local_c0 = i * 0x200000 + local_c0 + -0x200000;
      _result = local_28 + 4;
      if ((bVar1 & 0x80) != 0) {
        _result = local_28 + 5;
        bVar1 = local_28[4];
        i = (int)bVar1;
        local_c0 = i * 0x10000000 + local_c0 + -0x10000000;
        if ((bVar1 & 0x80) != 0) {
          for (local_c4 = 0; local_c4 < 5; local_c4 = local_c4 + 1) {
            pbVar5 = _result + 1;
            bVar1 = *_result;
            i = (int)bVar1;
            _result = pbVar5;
            if ((bVar1 & 0x80) == 0) goto LAB_0046a05f;
          }
          local_c5 = false;
          pVar7 = std::make_pair<bool,unsigned_char_const*&>(&local_c5,(uchar **)&result);
          local_10 = pVar7.second;
          local_18 = pVar7.first;
          goto LAB_0046a08c;
        }
      }
    }
  }
LAB_0046a05f:
  *(int *)absl_log_internal_check_op_result_1 = local_c0;
  local_c6 = true;
  pVar7 = std::make_pair<bool,unsigned_char_const*&>(&local_c6,(uchar **)&result);
  local_10 = pVar7.second;
  local_18 = pVar7.first;
LAB_0046a08c:
  if ((local_18 & 1) == 0) {
    this_local = (CodedInputStream *)0xffffffffffffffff;
  }
  else {
    this->buffer_ = local_10;
    this_local = (CodedInputStream *)(ulong)(uint)p.second;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t CodedInputStream::ReadVarint32Fallback(uint32_t first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32_t temp;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32_t temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64_t>(temp) : -1;
  }
}